

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

void __thiscall S2CellUnion::Encode(S2CellUnion *this,Encoder *encoder)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  S2CellId *cell_id;
  const_iterator __end1;
  const_iterator __begin1;
  vector<S2CellId,_std::allocator<S2CellId>_> *__range1;
  Encoder *encoder_local;
  S2CellUnion *this_local;
  
  sVar2 = std::vector<S2CellId,_std::allocator<S2CellId>_>::size(&this->cell_ids_);
  Encoder::Ensure(encoder,(sVar2 + 1) * 8 + 1);
  Encoder::put8(encoder,'\x01');
  sVar2 = std::vector<S2CellId,_std::allocator<S2CellId>_>::size(&this->cell_ids_);
  Encoder::put64(encoder,sVar2);
  __end1 = std::vector<S2CellId,_std::allocator<S2CellId>_>::begin(&this->cell_ids_);
  cell_id = (S2CellId *)std::vector<S2CellId,_std::allocator<S2CellId>_>::end(&this->cell_ids_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                                *)&cell_id);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
              ::operator*(&__end1);
    S2CellId::Encode(this_00,encoder);
    __gnu_cxx::
    __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void S2CellUnion::Encode(Encoder* const encoder) const {
  // Unsigned char for version number, and N+1 uint64's for N cell_ids
  // (1 for vector length, N for the ids).
  encoder->Ensure(sizeof(unsigned char) +
                  sizeof(uint64) * (1 + cell_ids_.size()));

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  encoder->put64(uint64{cell_ids_.size()});
  for (const S2CellId& cell_id : cell_ids_) {
    cell_id.Encode(encoder);
  }
}